

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_merkletree.cpp
# Opt level: O3

void __thiscall
TaprootScriptTree_Branch_Test::~TaprootScriptTree_Branch_Test(TaprootScriptTree_Branch_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TaprootScriptTree, Branch) {
  Privkey key("305e293b010d29bf3c888b617763a438fee9054c8cab66eb12ad078f819d9f27");
  Pubkey pubkey = key.GeneratePubkey();
  bool is_parity = false;
  SchnorrPubkey schnorr_pubkey = SchnorrPubkey::FromPubkey(pubkey, &is_parity);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb",
      schnorr_pubkey.GetHex());
  EXPECT_TRUE(is_parity);

  Script script = (ScriptBuilder() << ScriptOperator::OP_TRUE).Build();
  uint8_t leaf_version = 0xc4;
  std::vector<ByteData256> nodes = {
    ByteData256("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"),
    ByteData256("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54")
  };
  TaprootScriptTree tree(leaf_version, script);
  tree.AddBranch(TapBranch(nodes[0]));
  tree.AddBranch(SchnorrPubkey(nodes[1]));

  EXPECT_EQ(leaf_version, tree.GetLeafVersion());
  EXPECT_EQ(script.GetHex(), tree.GetScript().GetHex());
  EXPECT_EQ(nodes.size(), tree.GetNodeList().size());
  if (nodes.size() == tree.GetNodeList().size()) {
    for (size_t index=0; index<nodes.size(); ++index) {
      EXPECT_EQ(nodes[index].GetHex(), tree.GetNodeList()[index].GetHex());
    }
  }
  EXPECT_EQ("b893df7b9b277874f3427de6af5a8d9b1ba5ba6be139557d7a1db9cc4a4e5dae",
      tree.GetTapLeafHash().GetHex());
  EXPECT_EQ("daf066945913caa54e4ccfe32f0ca769b6c06679191cc01b9d96664226a1ffb4",
      tree.GetCurrentBranchHash().GetHex());
  EXPECT_EQ("cbdec1ab4d09f48ada05aacd1507e89d60671e37c8b3f714b3f6f6fbd6c71a2a",
      tree.GetTweakedPubkey(schnorr_pubkey).GetHex());
  EXPECT_EQ("9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
      tree.GetTweakedPrivkey(key).GetHex());

  TaprootScriptTree tree2(tree);
  EXPECT_EQ("9d7a9466774edd50d61e404568ecd7690ec8b2a656bb30ae66858a28a8a776ab",
      tree2.GetTweakedPrivkey(key).GetHex());

  ByteData256 msg("e5b11ddceab1e4fc49a8132ae589a39b07acf49cabb2b0fbf6104bc31da12c02");
  auto pk = tree.GetTweakedPubkey(schnorr_pubkey);
  auto sk = tree.GetTweakedPrivkey(key);
  auto sig = SchnorrUtil::Sign(msg, sk);
  EXPECT_TRUE(pk.Verify(sig, msg));

  auto tree_str = tree.ToString();
  std::string exp_tree_str = "{{4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d,tl(51,c4)},dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54}";
  EXPECT_EQ(exp_tree_str, tree_str);

  try {
    auto br = TapBranch::FromString(exp_tree_str);
    EXPECT_EQ(exp_tree_str, br.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }

  try {
    auto rebuild_tree = TaprootScriptTree::FromString(exp_tree_str, script);
    EXPECT_EQ(exp_tree_str, rebuild_tree.ToString());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
  }
}